

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t default_write_chunk(exr_encode_pipeline_t *encode)

{
  undefined8 unaff_RBX;
  uint64_t in_RDI;
  exr_context_t unaff_R14;
  exr_context_t unaff_retaddr;
  void *in_stack_00000010;
  uint64_t in_stack_00000018;
  void *in_stack_00000020;
  uint64_t in_stack_00000028;
  void *in_stack_00000030;
  exr_result_t rv;
  uint64_t in_stack_00000040;
  void *in_stack_00000048;
  uint64_t in_stack_00000050;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  exr_result_t eVar1;
  int levelx;
  int tiley;
  int part_index;
  
  if (in_RDI == 0) {
    eVar1 = 3;
  }
  else {
    levelx = (int)unaff_RBX;
    tiley = (int)((ulong)unaff_RBX >> 0x20);
    part_index = (int)((ulong)unaff_R14 >> 0x20);
    switch((ulong)*(byte *)(in_RDI + 0x2e)) {
    case 0:
      eVar1 = exr_write_scanline_chunk
                        ((exr_context_t)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                         (int)(in_RDI >> 0x20),(int)in_RDI,
                         (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (ulong)*(byte *)(in_RDI + 0x2e));
      break;
    case 1:
      eVar1 = exr_write_tile_chunk
                        (unaff_retaddr,part_index,(int)unaff_R14,tiley,levelx,
                         in_stack_ffffffffffffffec,in_stack_00000020,in_stack_00000028);
      break;
    case 2:
      if ((*(long *)(in_RDI + 0x88) == 0) || (*(long *)(in_RDI + 0x90) == 0)) {
        eVar1 = 3;
      }
      else {
        eVar1 = exr_write_deep_scanline_chunk
                          (unaff_R14,tiley,levelx,
                           (void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                           in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                           in_stack_00000010,in_stack_00000018);
      }
      break;
    case 3:
      if ((*(long *)(in_RDI + 0x88) == 0) || (*(long *)(in_RDI + 0x90) == 0)) {
        eVar1 = 3;
      }
      else {
        eVar1 = exr_write_deep_tile_chunk
                          (unaff_retaddr,part_index,(int)unaff_R14,tiley,levelx,
                           in_stack_ffffffffffffffec,in_stack_00000030,(uint64_t)encode,
                           in_stack_00000040,in_stack_00000048,in_stack_00000050);
      }
      break;
    case 4:
    default:
      eVar1 = 3;
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
default_write_chunk (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;

    if (!encode) return EXR_ERR_INVALID_ARGUMENT;

    switch (encode->chunk.type)
    {
        case EXR_STORAGE_SCANLINE:
            rv = exr_write_scanline_chunk (
                EXR_CONST_CAST (exr_context_t, encode->context),
                encode->part_index,
                encode->chunk.start_y,
                encode->compressed_buffer,
                encode->compressed_bytes);
            break;
        case EXR_STORAGE_TILED:
            rv = exr_write_tile_chunk (
                EXR_CONST_CAST (exr_context_t, encode->context),
                encode->part_index,
                encode->chunk.start_x,
                encode->chunk.start_y,
                encode->chunk.level_x,
                encode->chunk.level_y,
                encode->compressed_buffer,
                encode->compressed_bytes);
            break;
        case EXR_STORAGE_DEEP_SCANLINE:
            if (!encode->packed_sample_count_table ||
                encode->packed_sample_count_bytes == 0)
                return EXR_ERR_INVALID_ARGUMENT;
            rv = exr_write_deep_scanline_chunk (
                EXR_CONST_CAST (exr_context_t, encode->context),
                encode->part_index,
                encode->chunk.start_y,
                encode->compressed_buffer,
                encode->compressed_bytes,
                encode->packed_bytes,
                encode->packed_sample_count_table,
                encode->packed_sample_count_bytes);
            break;
        case EXR_STORAGE_DEEP_TILED:
            if (!encode->packed_sample_count_table ||
                encode->packed_sample_count_bytes == 0)
                return EXR_ERR_INVALID_ARGUMENT;
            rv = exr_write_deep_tile_chunk (
                EXR_CONST_CAST (exr_context_t, encode->context),
                encode->part_index,
                encode->chunk.start_x,
                encode->chunk.start_y,
                encode->chunk.level_x,
                encode->chunk.level_y,
                encode->compressed_buffer,
                encode->compressed_bytes,
                encode->packed_bytes,
                encode->packed_sample_count_table,
                encode->packed_sample_count_bytes);
            break;
        case EXR_STORAGE_LAST_TYPE:
        default: rv = EXR_ERR_INVALID_ARGUMENT; break;
    }
    return rv;
}